

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall CoreML::NeuralNetworkShaper::print(NeuralNetworkShaper *this)

{
  _Rb_tree_node_base *p_Var1;
  long *plVar2;
  _Self __tmp;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Network Shapes: ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  for (p_Var1 = (this->blobShapes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->blobShapes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    ::operator<<((ostream *)&std::cout,(ShapeConstraint *)(p_Var1 + 2));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void NeuralNetworkShaper::print() const {

    std::cout << "Network Shapes: " << std::endl;
    for (auto ind = blobShapes.begin(); ind != blobShapes.end(); ind++) {
        std::cout << ind->second;
    }
    std::cout << std::endl << std::endl;

}